

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTempor.c
# Opt level: O1

Aig_Man_t *
Saig_ManTempor(Aig_Man_t *pAig,int nFrames,int TimeOut,int nConfLimit,int fUseBmc,int fUseTransSigs,
              int fVerbose,int fVeryVerbose)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  Vec_Int_t *vTransSigs;
  int local_38;
  int nFramesFinished;
  
  vTransSigs = (Vec_Int_t *)0x0;
  nFramesFinished = -1;
  local_38 = fUseTransSigs;
  if (nFrames < 0) {
    __assert_fail("nFrames >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTempor.c"
                  ,0xc0,"Aig_Man_t *Saig_ManTempor(Aig_Man_t *, int, int, int, int, int, int, int)")
    ;
  }
  pAVar3 = pAig;
  if (nFrames == 0) {
    uVar2 = Saig_ManPhasePrefixLength(pAig,fVerbose,fVeryVerbose,&vTransSigs);
    if (uVar2 == 1) {
      if (vTransSigs != (Vec_Int_t *)0x0) {
        if (vTransSigs->pArray != (int *)0x0) {
          free(vTransSigs->pArray);
          vTransSigs->pArray = (int *)0x0;
        }
        if (vTransSigs != (Vec_Int_t *)0x0) {
          free(vTransSigs);
          vTransSigs = (Vec_Int_t *)0x0;
        }
      }
      pcVar8 = "The leading sequence has length 1. Temporal decomposition is not performed.";
    }
    else {
      if (uVar2 != 0) {
        if (local_38 == 0) {
LAB_006f0553:
          uVar7 = (ulong)uVar2;
        }
        else {
          if ((long)vTransSigs->nSize < 1) {
            uVar7 = 0xffffffff;
          }
          else {
            uVar7 = 0xffffffff;
            uVar9 = 0;
            do {
              if (vTransSigs->pArray[uVar9] != 0) {
                uVar7 = uVar9 & 0xffffffff;
              }
              uVar9 = uVar9 + 1;
            } while ((long)vTransSigs->nSize != uVar9);
          }
          if ((int)uVar2 <= (int)uVar7 || (int)uVar7 < 1) goto LAB_006f0553;
          Abc_Print((int)pAVar3,"Reducing frame count from %d to %d to fit the last transient.\n",
                    (ulong)uVar2,uVar7);
        }
        pcVar8 = "Using computed frame number (%d).\n";
        goto LAB_006f0263;
      }
      if (vTransSigs != (Vec_Int_t *)0x0) {
        if (vTransSigs->pArray != (int *)0x0) {
          free(vTransSigs->pArray);
          vTransSigs->pArray = (int *)0x0;
        }
        if (vTransSigs != (Vec_Int_t *)0x0) {
          free(vTransSigs);
          vTransSigs = (Vec_Int_t *)0x0;
        }
      }
      pcVar8 = "The leading sequence has length 0. Temporal decomposition is not performed.";
    }
    puts(pcVar8);
LAB_006f0518:
    pAVar3 = (Aig_Man_t *)0x0;
  }
  else {
    uVar7 = (ulong)(uint)nFrames;
    pcVar8 = "Using user-given frame number (%d).\n";
LAB_006f0263:
    uVar2 = (uint)uVar7;
    Abc_Print((int)pAVar3,pcVar8,uVar7);
    if (fUseBmc != 0) {
      iVar1 = Saig_BmcPerform(pAig,0,uVar2,2000,TimeOut,nConfLimit,0,fVerbose,0,&nFramesFinished,0,0
                             );
      if (iVar1 == 0) {
        if (vTransSigs != (Vec_Int_t *)0x0) {
          if (vTransSigs->pArray != (int *)0x0) {
            free(vTransSigs->pArray);
            vTransSigs->pArray = (int *)0x0;
          }
          if (vTransSigs != (Vec_Int_t *)0x0) {
            free(vTransSigs);
            vTransSigs = (Vec_Int_t *)0x0;
          }
        }
        printf("A cex found in the first %d frames.\n",uVar7);
        return (Aig_Man_t *)0x0;
      }
      if (nFramesFinished + 1 < (int)uVar2) {
        if (vTransSigs == (Vec_Int_t *)0x0) {
LAB_006f0446:
          uVar10 = 0xffffffff;
        }
        else {
          uVar6 = vTransSigs->nSize;
          uVar5 = vTransSigs->nSize - 1;
          do {
            uVar4 = uVar5;
            if ((int)uVar6 < 1) goto LAB_006f0446;
            uVar10 = uVar6 - 1;
            uVar5 = uVar4 - 1;
            bVar11 = nFramesFinished < (int)uVar6;
            uVar6 = uVar10;
          } while ((bVar11) || (vTransSigs->pArray[uVar4] == 0));
        }
        bVar11 = local_38 == 0;
        if (bVar11 || (int)uVar10 < 1) {
          if (vTransSigs != (Vec_Int_t *)0x0) {
            if (vTransSigs->pArray != (int *)0x0) {
              free(vTransSigs->pArray);
              vTransSigs->pArray = (int *)0x0;
            }
            if (vTransSigs != (Vec_Int_t *)0x0) {
              free(vTransSigs);
              vTransSigs = (Vec_Int_t *)0x0;
            }
          }
          printf("BMC for %d frames could not be completed. A cex may exist!\n",uVar7);
        }
        else {
          if (nFramesFinished <= (int)uVar10) {
            __assert_fail("iLastBefore < nFramesFinished",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTempor.c"
                          ,0xf2,
                          "Aig_Man_t *Saig_ManTempor(Aig_Man_t *, int, int, int, int, int, int, int)"
                         );
          }
          printf("BMC succeeded to frame %d. Adjusting frame count to be (%d) based on the last transient signal.\n"
                 ,(ulong)(uint)nFramesFinished,(ulong)uVar10);
          uVar2 = uVar10;
        }
        if (bVar11 || (int)uVar10 < 1) goto LAB_006f0518;
      }
    }
    if (vTransSigs != (Vec_Int_t *)0x0) {
      if (vTransSigs->pArray != (int *)0x0) {
        free(vTransSigs->pArray);
        vTransSigs->pArray = (int *)0x0;
      }
      if (vTransSigs != (Vec_Int_t *)0x0) {
        free(vTransSigs);
        vTransSigs = (Vec_Int_t *)0x0;
      }
    }
    pAVar3 = Saig_ManTemporDecompose(pAig,uVar2);
  }
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManTempor( Aig_Man_t * pAig, int nFrames, int TimeOut, int nConfLimit, int fUseBmc, int fUseTransSigs, int fVerbose, int fVeryVerbose )
{ 
    extern int Saig_ManPhasePrefixLength( Aig_Man_t * p, int fVerbose, int fVeryVerbose, Vec_Int_t ** pvTrans );

    Vec_Int_t * vTransSigs = NULL;
    int RetValue, nFramesFinished = -1;
    assert( nFrames >= 0 ); 
    if ( nFrames == 0 )
    {
        nFrames = Saig_ManPhasePrefixLength( pAig, fVerbose, fVeryVerbose, &vTransSigs );
        if ( nFrames == 0 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "The leading sequence has length 0. Temporal decomposition is not performed.\n" );
            return NULL;
        }
        if ( nFrames == 1 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "The leading sequence has length 1. Temporal decomposition is not performed.\n" );
            return NULL;
        }
        if ( fUseTransSigs )
        {
            int Entry, i, iLast = -1;
            Vec_IntForEachEntry( vTransSigs, Entry, i )
                iLast = Entry ? i :iLast;
            if ( iLast > 0 && iLast < nFrames )
            {
                Abc_Print( 1, "Reducing frame count from %d to %d to fit the last transient.\n", nFrames, iLast );
                nFrames = iLast;
            }
        }
        Abc_Print( 1, "Using computed frame number (%d).\n", nFrames );
    }
    else
        Abc_Print( 1, "Using user-given frame number (%d).\n", nFrames );
    // run BMC2
    if ( fUseBmc )
    {
        RetValue = Saig_BmcPerform( pAig, 0, nFrames, 2000, TimeOut, nConfLimit, 0, fVerbose, 0, &nFramesFinished, 0, 0 );
        if ( RetValue == 0 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "A cex found in the first %d frames.\n", nFrames );
            return NULL;
        }
        if ( nFramesFinished + 1 < nFrames )
        {
            int iLastBefore = Vec_IntLastNonZeroBeforeLimit( vTransSigs, nFramesFinished );
            if ( iLastBefore < 1 || !fUseTransSigs )
            {
                Vec_IntFreeP( &vTransSigs );
                printf( "BMC for %d frames could not be completed. A cex may exist!\n", nFrames );
                return NULL;
            }
            assert( iLastBefore < nFramesFinished );
            printf( "BMC succeeded to frame %d. Adjusting frame count to be (%d) based on the last transient signal.\n", nFramesFinished, iLastBefore );
            nFrames = iLastBefore;
        }
    }
    Vec_IntFreeP( &vTransSigs );
    return Saig_ManTemporDecompose( pAig, nFrames );
}